

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::TexelBufferDescriptorCase::
genResourceAccessSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  ostringstream local_1b0 [8];
  ostringstream buf;
  char *fetchFunc;
  char *accessPostfixB;
  char *accessPostfixA;
  VkShaderStageFlagBits stage_local;
  TexelBufferDescriptorCase *this_local;
  
  if (*(int *)((long)this + 0x88) == 0) {
    local_1e0 = "";
  }
  else {
    if (*(int *)((long)this + 0x88) == 1) {
      local_1e8 = "A";
    }
    else {
      local_1e8 = (char *)0x0;
      if (*(int *)((long)this + 0x88) == 3) {
        local_1e8 = "[0]";
      }
    }
    local_1e0 = local_1e8;
  }
  if (*(int *)((long)this + 0x88) == 0) {
    local_1f0 = "";
  }
  else {
    if (*(int *)((long)this + 0x88) == 1) {
      local_1f8 = "B";
    }
    else {
      local_1f8 = (char *)0x0;
      if (*(int *)((long)this + 0x88) == 3) {
        local_1f8 = "[1]";
      }
    }
    local_1f0 = local_1f8;
  }
  bVar1 = BindingModel::anon_unknown_1::isUniformDescriptorType
                    (*(VkDescriptorType *)((long)this + 0x84));
  pcVar3 = "imageLoad";
  if (bVar1) {
    pcVar3 = "texelFetch";
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar4 = std::operator<<((ostream *)local_1b0,"\tif (quadrant_id == 0)\n");
  poVar4 = std::operator<<(poVar4,"\t\tresult_color = ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"(u_texelBuffer");
  poVar4 = std::operator<<(poVar4,local_1e0);
  poVar4 = std::operator<<(poVar4,", ");
  iVar2 = BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::getFetchPos(0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,");\n");
  poVar4 = std::operator<<(poVar4,"\telse if (quadrant_id == 1)\n");
  poVar4 = std::operator<<(poVar4,"\t\tresult_color = ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"(u_texelBuffer");
  poVar4 = std::operator<<(poVar4,local_1f0);
  poVar4 = std::operator<<(poVar4,", ");
  iVar2 = BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::getFetchPos(1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,");\n");
  poVar4 = std::operator<<(poVar4,"\telse if (quadrant_id == 2)\n");
  poVar4 = std::operator<<(poVar4,"\t\tresult_color = ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"(u_texelBuffer");
  poVar4 = std::operator<<(poVar4,local_1e0);
  poVar4 = std::operator<<(poVar4,", ");
  iVar2 = BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::getFetchPos(2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,");\n");
  poVar4 = std::operator<<(poVar4,"\telse\n");
  poVar4 = std::operator<<(poVar4,"\t\tresult_color = ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"(u_texelBuffer");
  poVar4 = std::operator<<(poVar4,local_1f0);
  poVar4 = std::operator<<(poVar4,", ");
  iVar2 = BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::getFetchPos(3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,");\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelBufferDescriptorCase::genResourceAccessSource (vk::VkShaderStageFlagBits stage) const
{
	DE_UNREF(stage);

	const char* const	accessPostfixA	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? ("")
										: (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? ("A")
										: (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? ("[0]")
										: (DE_NULL);
	const char* const	accessPostfixB	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? ("")
										: (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? ("B")
										: (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? ("[1]")
										: (DE_NULL);
	const char* const	fetchFunc		= (isUniformDescriptorType(m_descriptorType)) ? ("texelFetch") : ("imageLoad");
	std::ostringstream	buf;

	buf << "	if (quadrant_id == 0)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixA << ", " << TexelBufferInstanceBuffers::getFetchPos(0) << ");\n"
		<< "	else if (quadrant_id == 1)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixB << ", " << TexelBufferInstanceBuffers::getFetchPos(1) << ");\n"
		<< "	else if (quadrant_id == 2)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixA << ", " << TexelBufferInstanceBuffers::getFetchPos(2) << ");\n"
		<< "	else\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixB << ", " << TexelBufferInstanceBuffers::getFetchPos(3) << ");\n";

	return buf.str();
}